

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void amrex::CreateDirectoryFailed(string *dir)

{
  string *in_RDI;
  string msg;
  char *in_stack_ffffffffffffffc0;
  allocator local_31;
  string local_30 [32];
  string *local_10;
  undefined8 local_8;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Couldn\'t create directory: ",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::__cxx11::string::operator+=(local_30,local_10);
  local_8 = std::__cxx11::string::c_str();
  Error_host(in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void
amrex::CreateDirectoryFailed (const std::string& dir)
{
    std::string msg("Couldn't create directory: ");
    msg += dir;
    amrex::Error(msg.c_str());
}